

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

int __thiscall Assimp::CFIReaderImpl::getAttributeValueAsInt(CFIReaderImpl *this,char *name)

{
  int iVar1;
  Attribute *pAVar2;
  undefined4 extraout_var;
  shared_ptr<const_Assimp::FIIntValue> intValue;
  shared_ptr<const_Assimp::FIValue> local_20;
  
  pAVar2 = getAttributeByName(this,name);
  if (pAVar2 == (Attribute *)0x0) {
    iVar1 = 0;
  }
  else {
    std::dynamic_pointer_cast<Assimp::FIIntValue_const,Assimp::FIValue_const>(&local_20);
    if (local_20.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      iVar1 = (**((pAVar2->value).
                  super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 _vptr_FIValue)();
      iVar1 = atoi(*(char **)CONCAT44(extraout_var,iVar1));
    }
    else {
      iVar1 = 0;
      if ((long)local_20.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr[2]._vptr_FIValue -
          (long)local_20.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr[1]._vptr_FIValue == 4) {
        iVar1 = *(int *)local_20.
                        super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        [1]._vptr_FIValue;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_20.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return iVar1;
}

Assistant:

virtual int getAttributeValueAsInt(const char* name) const /*override*/ {
        const Attribute* attr = getAttributeByName(name);
        if (!attr) {
            return 0;
        }
        std::shared_ptr<const FIIntValue> intValue = std::dynamic_pointer_cast<const FIIntValue>(attr->value);
        if (intValue) {
            return intValue->value.size() == 1 ? intValue->value.front() : 0;
        }
        return atoi(attr->value->toString().c_str());
    }